

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O0

long vorbis_book_decodevs_add(codebook *book,ogg_int32_t *a,oggpack_buffer *b,int n,int point)

{
  oggpack_buffer *poVar1;
  long lVar2;
  ogg_int32_t *poVar3;
  undefined8 uStack_60;
  undefined8 local_58;
  int shift;
  int o;
  int j;
  int i;
  ogg_int32_t **t;
  long *entry;
  int local_30;
  int step;
  int point_local;
  int n_local;
  oggpack_buffer *b_local;
  ogg_int32_t *a_local;
  codebook *book_local;
  
  if (0 < book->used_entries) {
    entry._4_4_ = (int)((long)n / book->dim);
    t = (ogg_int32_t **)((long)&local_58 - ((long)entry._4_4_ * 8 + 0xfU & 0xfffffffffffffff0));
    lVar2 = (long)t - ((long)entry._4_4_ * 8 + 0xfU & 0xfffffffffffffff0);
    local_58._0_4_ = point - book->binarypoint;
    _j = lVar2;
    local_30 = point;
    step = n;
    _point_local = b;
    b_local = (oggpack_buffer *)a;
    a_local = (ogg_int32_t *)book;
    if ((int)local_58 < 0) {
      for (o = 0; poVar3 = a_local, poVar1 = _point_local, o < entry._4_4_; o = o + 1) {
        *(undefined8 *)(lVar2 + -8) = 0x154386;
        poVar3 = (ogg_int32_t *)decode_packed_entry_number((codebook *)poVar3,poVar1);
        t[o] = poVar3;
        if (t[o] == (ogg_int32_t *)0xffffffffffffffff) {
          return -1;
        }
        *(long *)(_j + (long)o * 8) = *(long *)(a_local + 8) + (long)t[o] * *(long *)a_local * 4;
      }
      local_58._4_4_ = 0;
      for (o = 0; (long)o < *(long *)a_local; o = o + 1) {
        for (shift = 0; shift < entry._4_4_; shift = shift + 1) {
          (&b_local->headbit)[local_58._4_4_ + shift] =
               (*(int *)(*(long *)(_j + (long)shift * 8) + (long)o * 4) <<
               (-(char)(int)local_58 & 0x1fU)) + (&b_local->headbit)[local_58._4_4_ + shift];
        }
        local_58._4_4_ = entry._4_4_ + local_58._4_4_;
      }
    }
    else {
      for (o = 0; poVar3 = a_local, poVar1 = _point_local, o < entry._4_4_; o = o + 1) {
        *(undefined8 *)(lVar2 + -8) = 0x15428a;
        poVar3 = (ogg_int32_t *)decode_packed_entry_number((codebook *)poVar3,poVar1);
        t[o] = poVar3;
        if (t[o] == (ogg_int32_t *)0xffffffffffffffff) {
          return -1;
        }
        *(long *)(_j + (long)o * 8) = *(long *)(a_local + 8) + (long)t[o] * *(long *)a_local * 4;
      }
      local_58._4_4_ = 0;
      for (o = 0; (long)o < *(long *)a_local; o = o + 1) {
        for (shift = 0; shift < entry._4_4_; shift = shift + 1) {
          (&b_local->headbit)[local_58._4_4_ + shift] =
               (*(int *)(*(long *)(_j + (long)shift * 8) + (long)o * 4) >>
               ((byte)(int)local_58 & 0x1f)) + (&b_local->headbit)[local_58._4_4_ + shift];
        }
        local_58._4_4_ = entry._4_4_ + local_58._4_4_;
      }
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodevs_add(codebook *book,ogg_int32_t *a,
			      oggpack_buffer *b,int n,int point){
  if(book->used_entries>0){  
    int step=n/book->dim;
    long *entry = (long *)alloca(sizeof(*entry)*step);
    ogg_int32_t **t = (ogg_int32_t **)alloca(sizeof(*t)*step);
    int i,j,o;
    int shift=point-book->binarypoint;
    
    if(shift>=0){
      for (i = 0; i < step; i++) {
	entry[i]=decode_packed_entry_number(book,b);
	if(entry[i]==-1)return(-1);
	t[i] = book->valuelist+entry[i]*book->dim;
      }
      for(i=0,o=0;i<book->dim;i++,o+=step)
	for (j=0;j<step;j++)
	  a[o+j]+=t[j][i]>>shift;
    }else{
      for (i = 0; i < step; i++) {
	entry[i]=decode_packed_entry_number(book,b);
	if(entry[i]==-1)return(-1);
	t[i] = book->valuelist+entry[i]*book->dim;
      }
      for(i=0,o=0;i<book->dim;i++,o+=step)
	for (j=0;j<step;j++)
	  a[o+j]+=t[j][i]<<-shift;
    }
  }
  return(0);
}